

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * __thiscall pugi::xml_node::child_value(xml_node *this,char_t *name_)

{
  char_t *pcVar1;
  xml_node local_8;
  
  local_8 = child(this,name_);
  pcVar1 = child_value(&local_8);
  return pcVar1;
}

Assistant:

PUGI__FN const char_t* xml_node::child_value(const char_t* name_) const
	{
		return child(name_).child_value();
	}